

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadedSocketAcceptor.cpp
# Opt level: O1

void __thiscall
FIX::ThreadedSocketAcceptor::addThread(ThreadedSocketAcceptor *this,socket_handle s,thread_id t)

{
  int iVar1;
  mapped_type_conflict2 *pmVar2;
  key_type local_24;
  
  Mutex::lock(&this->m_mutex);
  pmVar2 = std::
           map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
           ::operator[](&this->m_threads,&local_24);
  *pmVar2 = t;
  iVar1 = (this->m_mutex).m_count;
  (this->m_mutex).m_count = iVar1 + -1;
  if (iVar1 < 2) {
    (this->m_mutex).m_threadID = 0;
    pthread_mutex_unlock((pthread_mutex_t *)&this->m_mutex);
  }
  return;
}

Assistant:

void ThreadedSocketAcceptor::addThread(socket_handle s, thread_id t) {
  Locker l(m_mutex);

  m_threads[s] = t;
}